

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::
iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
::iterator_base(iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *this,TreeIterator tree_it,InnerMap *m,size_type index)

{
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  this->node_ = (Node *)tree_it._M_node[1]._M_parent;
  this->m_ = m;
  this->bucket_index_ = index;
  if ((index & 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x211);
    other = internal::LogMessage::operator<<
                      (&local_40,"CHECK failed: (bucket_index_ % 2) == (0u): ");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
  }
  return;
}

Assistant:

static Node* NodeFromTreeIterator(TreeIterator it) {
      return static_cast<Node*>(it->second);
    }